

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O1

uint8_t * cbor_text_skip(uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  byte bVar1;
  long in_RAX;
  uint8_t *puVar2;
  int iVar3;
  int64_t val_1;
  long local_28;
  
  if (val == -1) {
    local_28 = in_RAX;
    if (in != (uint8_t *)0x0 && in < in_max) {
      while (*in != 0xff) {
        bVar1 = *in;
        puVar2 = cbor_get_number(in,in_max,&local_28);
        if (puVar2 == (uint8_t *)0x0) {
          iVar3 = (int)local_28;
LAB_0018819b:
          *err = iVar3;
          in = (byte *)0x0;
        }
        else {
          iVar3 = -3;
          if (((local_28 < 0) || (in = puVar2 + local_28, in_max < in)) || ((bVar1 & 0xe0) != 0x60))
          goto LAB_0018819b;
        }
        if (in_max <= in) {
          return in;
        }
        if (in == (byte *)0x0) {
          return (uint8_t *)0x0;
        }
      }
      in = in + 1;
    }
  }
  else {
    in = in + val;
    if (in_max < in || val < 0) {
      *err = -3;
      in = (byte *)0x0;
    }
  }
  return in;
}

Assistant:

uint8_t* cbor_text_skip(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    if (val == CBOR_END_OF_ARRAY) {
        while (in < in_max && in != NULL) {
            if (*in == CBOR_END_MARK) {
                in++;
                break;
            }
            else {
                int64_t val;
                int cbor_class = CBOR_CLASS(*in);

                in = cbor_get_number(in, in_max, &val);

                if (in == NULL) {
                    *err = (int)val;
                }
                else if (val < 0 || in + val > in_max || cbor_class != CBOR_T_TEXT) {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else if (val > 0) {
                    in += val;
                }
            }
        }
    }
    else {
        if (val < 0 || in + val > in_max) {
            *err = CBOR_MALFORMED_VALUE;
            in = NULL;
        }
        else if (val > 0) {
            in += val;
        }
    }
    return in;
}